

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric::GetMainInertiasInMassReference
          (ChBeamSectionTimoshenkoAdvancedGeneric *this,double *Jmyy,double *Jmzz,double *Jmyz,
          double *mass_phi,double *Qmy,double *Qmz)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  ulong extraout_XMM0_Qb;
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dStack_150;
  double dStack_140;
  undefined1 extraout_var [56];
  
  dVar32 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.Mz;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar32;
  dVar18 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.mu;
  dVar27 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.My;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar27;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jzz;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar27 * dVar18;
  auVar30 = vfnmadd213sd_fma(auVar30,auVar22,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyy;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar18 * dVar32;
  auVar6 = vfnmadd213sd_fma(auVar24,auVar33,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz;
  auVar5 = vfmsub213sd_fma(auVar22,auVar33,auVar7);
  dVar32 = (auVar6._0_8_ - auVar30._0_8_) * 0.5;
  dVar27 = auVar5._0_8_;
  dVar32 = dVar27 * dVar27 + dVar32 * dVar32;
  dVar18 = 0.0;
  if (0.0 < dVar32) {
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar32;
    auVar5 = vsqrtsd_avx(auVar34,auVar34);
    dVar32 = auVar5._0_8_;
    dVar18 = atan2(dVar27 / dVar32,(auVar30._0_8_ - auVar6._0_8_) / (dVar32 + dVar32));
    dVar18 = dVar18 * -0.5;
  }
  *mass_phi = dVar18;
  auVar17._0_8_ =
       (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.My
  ;
  auVar17._8_8_ =
       (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.Mz
  ;
  auVar6 = vpermilpd_avx(auVar17,1);
  dVar32 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.mu;
  auVar10._8_8_ = dVar32;
  auVar10._0_8_ = dVar32;
  auVar17 = vmulpd_avx512vl(auVar6,auVar10);
  auVar5 = vshufpd_avx(auVar17,auVar17,1);
  dVar32 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.Mz;
  dVar19 = cos(dVar18);
  dVar20 = sin(*mass_phi);
  dVar21 = cos(*mass_phi + *mass_phi);
  auVar23._0_8_ = sin(*mass_phi + *mass_phi);
  auVar23._8_56_ = extraout_var;
  dVar8 = dVar19 * dVar19;
  dVar9 = dVar20 * dVar20;
  auVar35._0_8_ = -dVar20;
  auVar35._8_8_ = extraout_XMM0_Qb ^ 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar35);
  dVar18 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.Mz;
  dVar27 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.My;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar27;
  auVar22 = auVar23._0_16_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar8 * dVar18 * -2.0;
  auVar30 = vfmadd231sd_fma(auVar41,auVar36,auVar22);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar9 * dVar18 * -2.0;
  auVar33 = vfnmadd231sd_fma(auVar39,auVar36,auVar22);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar9;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar27 * -2.0;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar23._0_8_ * dVar18;
  auVar24 = vfmadd231sd_fma(auVar42,auVar38,auVar28);
  auVar43._0_8_ = -auVar23._0_8_;
  auVar43._8_8_ = extraout_var._0_8_ ^ 0x8000000000000000;
  uVar2 = vmovlpd_avx(auVar43);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar8;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar23._0_8_ * -dVar18;
  auVar7 = vfmadd213sd_fma(auVar38,auVar25,auVar31);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar21;
  dVar27 = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz - auVar5._0_8_ * dVar32;
  auVar3._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyy;
  auVar3._8_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz;
  auVar34 = vfnmadd231sd_fma(auVar31,auVar36,auVar29);
  auVar5 = vmovhpd_avx(auVar3,(this->super_ChBeamSectionRayleighAdvancedGeneric).Jzz);
  auVar11._8_8_ = auVar6._8_8_ * auVar17._8_8_;
  auVar11._0_8_ = auVar6._0_8_ * auVar17._0_8_;
  auVar5 = vsubpd_avx(auVar5,auVar11);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar21 * dVar18;
  auVar22 = vfmsub231sd_fma(auVar26,auVar22,auVar36);
  auVar4._0_8_ = this->Qy;
  auVar4._8_8_ = this->Qz;
  auVar6 = vsubpd_avx(auVar4,auVar17);
  dVar18 = auVar6._0_8_;
  auVar44._0_8_ = dVar18 * dVar19;
  auVar44._8_8_ = dVar18 * dVar20;
  auVar40._0_8_ = dVar18 * auVar30._0_8_;
  auVar40._8_8_ = dVar18 * auVar33._0_8_;
  auVar37._0_8_ = auVar5._0_8_;
  auVar37._8_8_ = auVar37._0_8_;
  dStack_150 = auVar6._8_8_;
  auVar45._8_8_ = dStack_150;
  auVar45._0_8_ = dStack_150;
  dStack_140 = auVar5._8_8_;
  auVar46._8_8_ = dStack_140;
  auVar46._0_8_ = dStack_140;
  auVar47._8_8_ = dVar27;
  auVar47._0_8_ = dVar27;
  auVar12._8_8_ = dVar19;
  auVar12._0_8_ = uVar1;
  auVar5 = vfmadd231pd_fma(auVar44,auVar45,auVar12);
  auVar13._8_8_ = auVar7._0_8_;
  auVar13._0_8_ = auVar24._0_8_;
  auVar6 = vfmadd231pd_fma(auVar40,auVar45,auVar13);
  auVar5 = vfmadd231pd_fma(auVar5,auVar37,ZEXT816(0));
  auVar14._8_8_ = dVar9;
  auVar14._0_8_ = dVar8;
  auVar6 = vfmadd231pd_fma(auVar6,auVar37,auVar14);
  auVar5 = vfmadd231pd_fma(auVar5,auVar46,ZEXT816(0));
  auVar15._8_8_ = dVar8;
  auVar15._0_8_ = dVar9;
  auVar6 = vfmadd231pd_fma(auVar6,auVar46,auVar15);
  auVar5 = vfmadd231pd_fma(auVar5,auVar47,ZEXT816(0));
  auVar16._8_8_ = auVar23._0_8_;
  auVar16._0_8_ = uVar2;
  auVar6 = vfmadd231pd_fma(auVar6,auVar47,auVar16);
  dVar32 = (double)vmovlpd_avx(auVar5);
  *Qmy = dVar32;
  dVar32 = (double)vmovhpd_avx(auVar5);
  *Qmz = dVar32;
  dVar32 = (double)vmovlpd_avx(auVar6);
  *Jmyy = dVar32;
  dVar32 = (double)vmovhpd_avx(auVar6);
  *Jmzz = dVar32;
  *Jmyz = auVar34._0_8_ * dVar18 + auVar22._0_8_ * dStack_150 +
          auVar23._0_8_ * 0.5 * auVar37._0_8_ + auVar23._0_8_ * -0.5 * dStack_140 + dVar21 * dVar27;
  return;
}

Assistant:

void ChBeamSectionTimoshenkoAdvancedGeneric::GetMainInertiasInMassReference(double& Jmyy,
                                                                            double& Jmzz,
                                                                            double& Jmyz,
                                                                            double& mass_phi,
                                                                            double& Qmy,
                                                                            double& Qmz) {
    // inherit the algorithm from Rayleigh beam class, ignoring Qy,Qz to solve the mass_phi approximately.
    // remove inertia transport
    double Tyy_rot = this->Jyy - this->mu * this->Mz * this->Mz;
    double Tzz_rot = this->Jzz - this->mu * this->My * this->My;
    double Tyz_rot = -this->Jyz + this->mu * this->Mz * this->My;
    // tensor de-rotation up to principal axes
    double argum = pow((Tyy_rot - Tzz_rot) * 0.5, 2) + pow(Tyz_rot, 2);
    if (argum <= 0) {
        mass_phi = 0;
        // Jmyy = 0.5 * (Tzz_rot + Tyy_rot);
        // Jmzz = 0.5 * (Tzz_rot + Tyy_rot);
        // return;
    } else {
        double discr = sqrt(pow((Tyy_rot - Tzz_rot) * 0.5, 2) + pow(Tyz_rot, 2));
        mass_phi = -0.5 * atan2(Tyz_rot / discr, (Tzz_rot - Tyy_rot) / (2. * discr));
        // Jmyy = 0.5 * (Tzz_rot + Tyy_rot) - discr;
        // Jmzz = 0.5 * (Tzz_rot + Tyy_rot) + discr;
    }

    // a constant vector, which is from the mass center offset (My,Mz)
    EigenMat5x1 const_vec;
    const_vec.setZero();
    const_vec(0) = this->mu * this->Mz;
    const_vec(1) = this->mu * this->My;
    const_vec(2) = this->mu * this->Mz * this->Mz;
    const_vec(3) = this->mu * this->My * this->My;
    const_vec(4) = this->mu * this->My * this->Mz;

    // transformation matrix from the centerline of beam to the mass center coordinate system
    EigenMat5x5 Acl2cog;
    Acl2cog.setZero();
    double cosphi = cos(mass_phi);
    double sinphi = sin(mass_phi);
    double cos2phi = cos(2. * mass_phi);
    double sin2phi = sin(2. * mass_phi);
    double cosphi2 = cosphi * cosphi;
    double sinphi2 = sinphi * sinphi;

    Acl2cog(0, 0) = cosphi;
    Acl2cog(0, 1) = -sinphi;

    Acl2cog(1, 0) = sinphi;
    Acl2cog(1, 1) = cosphi;

    Acl2cog(2, 0) = this->My * sin2phi - 2. * this->Mz * cosphi2;
    Acl2cog(2, 1) = -2. * this->My * sinphi2 + this->Mz * sin2phi;
    Acl2cog(2, 2) = cosphi2;
    Acl2cog(2, 3) = sinphi2;
    Acl2cog(2, 4) = -sin2phi;

    Acl2cog(3, 0) = -this->My * sin2phi - 2. * this->Mz * sinphi2;
    Acl2cog(3, 1) = -2. * this->My * cosphi2 - this->Mz * sin2phi;
    Acl2cog(3, 2) = sinphi2;
    Acl2cog(3, 3) = cosphi2;
    Acl2cog(3, 4) = sin2phi;

    Acl2cog(4, 0) = -this->My * cos2phi - this->Mz * sin2phi;
    Acl2cog(4, 1) = this->My * sin2phi - this->Mz * cos2phi;
    Acl2cog(4, 2) = 1. / 2. * sin2phi;
    Acl2cog(4, 3) = -1. / 2. * sin2phi;
    Acl2cog(4, 4) = cos2phi;

    // a vector of mass properties expressed in the centerline of beam
    EigenMat5x1 J_vec;
    J_vec.setZero();

    J_vec(0) = this->Qy;
    J_vec(1) = this->Qz;
    J_vec(2) = this->Jyy;
    J_vec(3) = this->Jzz;
    J_vec(4) = this->Jyz;

    // define a vector of local mass properties expressed in mass center coordinate system
    EigenMat5x1 Jm_vec;
    Jm_vec.setZero();
    Jm_vec = Acl2cog * (J_vec - const_vec);

    Qmy = Jm_vec(0);
    Qmz = Jm_vec(1);
    Jmyy = Jm_vec(2);
    Jmzz = Jm_vec(3);
    Jmyz = Jm_vec(4);
}